

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::anon_unknown_0::GetSyncTypeTest::iterate(GetSyncTypeTest *this)

{
  ostringstream *poVar1;
  EGLSyncKHR *value;
  EGLDisplay *value_00;
  ostringstream *this_00;
  EGLenum EVar2;
  TestLog *pTVar3;
  int iVar4;
  deUint32 dVar5;
  Library *pLVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  TestError *this_01;
  char *pcVar8;
  char *pcVar9;
  EGLint type;
  MessageBuilder local_1b0;
  
  pLVar6 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar3 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*pLVar6->_vptr_Library[0x11])
                    (pLVar6,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,0);
  value = &(this->super_SyncTest).m_sync;
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar4);
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1b0,value);
  std::operator<<((ostream *)&pMVar7->m_str," = eglCreateSyncKHR(");
  value_00 = &(this->super_SyncTest).m_eglDisplay;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value_00);
  poVar1 = &pMVar7->m_str;
  std::operator<<((ostream *)poVar1,", ");
  EVar2 = (this->super_SyncTest).m_syncType;
  pcVar8 = "<Unknown>";
  if (EVar2 == 0x30fa) {
    pcVar8 = "EGL_SYNC_REUSABLE_KHR";
  }
  pcVar9 = "EGL_SYNC_FENCE_KHR";
  if (EVar2 != 0x30f9) {
    pcVar9 = pcVar8;
  }
  std::operator<<((ostream *)poVar1,pcVar9);
  std::operator<<((ostream *)poVar1,", NULL)");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar5,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x2b5);
  (*pLVar6->_vptr_Library[0x24])(pLVar6,*value_00,*value,0x30f7);
  dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
  eglu::checkError(dVar5,"getSyncAttribKHR(m_eglDisplay, m_sync, EGL_SYNC_TYPE_KHR, &type)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x2b8);
  this_00 = &local_1b0.m_str;
  local_1b0.m_log = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"eglGetSyncAttribKHR(");
  pMVar7 = tcu::MessageBuilder::operator<<(&local_1b0,value_00);
  std::operator<<((ostream *)&pMVar7->m_str,", ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value);
  poVar1 = &pMVar7->m_str;
  std::operator<<((ostream *)poVar1,", EGL_SYNC_TYPE_KHR, {");
  std::ostream::operator<<(poVar1,0);
  std::operator<<((ostream *)poVar1,"})");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  if ((this->super_SyncTest).m_syncType == 0) {
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"type == ((EGLint)m_syncType)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
             ,699);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult	iterate			(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint type = 0;
		EGLU_CHECK_CALL(egl, getSyncAttribKHR(m_eglDisplay, m_sync, EGL_SYNC_TYPE_KHR, &type));
		log << TestLog::Message << "eglGetSyncAttribKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_SYNC_TYPE_KHR, {" << type << "})" << TestLog::EndMessage;

		TCU_CHECK(type == ((EGLint)m_syncType));

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}